

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O3

void sat_solver_canceluntil(sat_solver *s,int level)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  
  uVar1 = (s->trail_lim).size;
  if (level < (int)uVar1) {
    if ((int)uVar1 < 1) {
      __assert_fail("veci_size(&s->trail_lim) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                    ,0x29c,"void sat_solver_canceluntil(sat_solver *, int)");
    }
    piVar4 = (s->trail_lim).ptr;
    iVar2 = piVar4[level];
    lVar6 = (long)s->qtail;
    if (iVar2 < s->qtail) {
      iVar3 = piVar4[(ulong)uVar1 - 1];
      do {
        iVar7 = s->trail[lVar6 + -1] >> 1;
        s->assigns[iVar7] = '\x03';
        s->reasons[iVar7] = 0;
        if (lVar6 <= iVar3) {
          s->polarity[iVar7] = ~*(byte *)(s->trail + lVar6 + -1) & 1;
        }
        lVar6 = lVar6 + -1;
      } while (iVar2 < lVar6);
    }
    lVar6 = (long)s->qhead;
    if (iVar2 < s->qhead) {
      do {
        lVar5 = lVar6 + -1;
        lVar6 = lVar6 + -1;
        order_unassigned(s,s->trail[lVar5] >> 1);
      } while (iVar2 < lVar6);
    }
    s->qtail = iVar2;
    s->qhead = iVar2;
    if ((s->trail_lim).size < level) {
      __assert_fail("k <= v->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satVec.h"
                    ,0x30,"void veci_resize(veci *, int)");
    }
    (s->trail_lim).size = level;
  }
  return;
}

Assistant:

static void sat_solver_canceluntil(sat_solver* s, int level) {
    int      bound;
    int      lastLev;
    int      c;
    
    if (sat_solver_dl(s) <= level)
        return;

    assert( veci_size(&s->trail_lim) > 0 );
    bound   = (veci_begin(&s->trail_lim))[level];
    lastLev = (veci_begin(&s->trail_lim))[veci_size(&s->trail_lim)-1];

    ////////////////////////////////////////
    // added to cancel all assignments
//    if ( level == -1 )
//        bound = 0;
    ////////////////////////////////////////

    for (c = s->qtail-1; c >= bound; c--) {
        int     x  = lit_var(s->trail[c]);
        var_set_value(s, x, varX);
        s->reasons[x] = 0;
        if ( c < lastLev )
            var_set_polar( s, x, !lit_sign(s->trail[c]) );
    }
    //printf( "\n" );

    for (c = s->qhead-1; c >= bound; c--)
        order_unassigned(s,lit_var(s->trail[c]));

    s->qhead = s->qtail = bound;
    veci_resize(&s->trail_lim,level);
}